

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

void llb_buildsystem_destroy(llb_buildsystem_t *system)

{
  if (system != (llb_buildsystem_t *)0x0) {
    std::
    unique_ptr<llbuild::buildsystem::BuildSystemFrontend,_std::default_delete<llbuild::buildsystem::BuildSystemFrontend>_>
    ::~unique_ptr((unique_ptr<llbuild::buildsystem::BuildSystemFrontend,_std::default_delete<llbuild::buildsystem::BuildSystemFrontend>_>
                   *)(system + 0x1f0));
    if (*(long **)(system + 0x1e8) != (long *)0x0) {
      (**(code **)(**(long **)(system + 0x1e8) + 8))();
    }
    *(undefined8 *)(system + 0x1e8) = 0;
    llvm::SourceMgr::~SourceMgr((SourceMgr *)(system + 0x1a8));
    llbuild::buildsystem::BuildSystemInvocation::~BuildSystemInvocation
              ((BuildSystemInvocation *)(system + 0xe8));
  }
  operator_delete(system,0x1f8);
  return;
}

Assistant:

void llb_buildsystem_destroy(llb_buildsystem_t* system) {
  delete (CAPIBuildSystem*)system;
}